

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

wchar_t my_strnicmp(char *a,char *b,wchar_t n)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  __int32_t **pp_Var4;
  long lVar5;
  char *s2;
  char *s1;
  
  if (n < L'\x01') {
    return L'\0';
  }
  pp_Var4 = __ctype_toupper_loc();
  lVar5 = 0;
  do {
    cVar1 = (char)(*pp_Var4)[(byte)a[lVar5]];
    cVar2 = (char)(*pp_Var4)[(byte)b[lVar5]];
    if (cVar1 < cVar2) {
      return L'\xffffffff';
    }
    if (cVar2 < cVar1) {
      return L'\x01';
    }
    if (cVar1 == '\0') {
      return L'\0';
    }
    lVar5 = lVar5 + 1;
    bVar3 = L'\x01' < n;
    n = n + L'\xffffffff';
  } while (bVar3);
  return L'\0';
}

Assistant:

int my_strnicmp(const char *a, const char *b, int n)
{
	const char *s1, *s2;
	char z1, z2;

	/* Scan the strings */
	for (s1 = a, s2 = b; n > 0; s1++, s2++, n--) {
		z1 = toupper((unsigned char)*s1);
		z2 = toupper((unsigned char)*s2);
		if (z1 < z2) return (-1);
		if (z1 > z2) return (1);
		if (!z1) return (0);
	}

	return 0;
}